

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void in_or_out_of_sub_groups
               (Am_Value_List *sub_groups,Am_Object *group,bool into_sub_group,bool recalc)

{
  bool bVar1;
  int left_offset;
  int top_offset;
  Am_Value *pAVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  Am_Value_List *objs;
  Am_Object *old_group;
  Am_Value_List *selected_objs;
  Am_Object *new_group;
  Am_Value_List sub_group_parts;
  Am_Object sub_group;
  Am_Value_List dummy_list;
  Am_Value_List local_100;
  Am_Object *local_f0;
  Am_Object local_e8;
  undefined4 local_e0;
  undefined4 local_dc;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  undefined1 local_b0 [16];
  Am_Object local_a0;
  Am_Value_List local_98;
  Am_Value_List local_88;
  Am_Value_List local_78;
  Am_Value_List local_68;
  Am_Value_List local_58;
  Am_Value_List local_48;
  
  local_e0 = (undefined4)CONCAT71(in_register_00000009,recalc);
  local_dc = (undefined4)CONCAT71(in_register_00000011,into_sub_group);
  local_f0 = group;
  Am_Value_List::Am_Value_List(&local_100);
  Am_Value_List::Am_Value_List(&local_98);
  local_e8.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(sub_groups);
  while( true ) {
    bVar1 = Am_Value_List::Last(sub_groups);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(sub_groups);
    Am_Object::operator=(&local_e8,pAVar2);
    pAVar2 = Am_Object::Get(&local_e8,100,0);
    left_offset = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(&local_e8,0x65,0);
    top_offset = Am_Value::operator_cast_to_int(pAVar2);
    pAVar2 = Am_Object::Get(&local_e8,0x1e4,0);
    Am_Value_List::operator=(&local_100,pAVar2);
    if ((char)local_dc == '\0') {
      Am_Value_List::Am_Value_List(&local_78,&local_100);
      adjust_objects_positions(&local_78,left_offset,top_offset);
      Am_Value_List::~Am_Value_List(&local_78);
      Am_Value_List::Am_Value_List(&local_88,&local_100);
      Am_Object::Am_Object(&local_d0,&local_e8);
      Am_Object::Am_Object(&local_d8,local_f0);
      selected_objs = (Am_Value_List *)local_b0;
      Am_Object::Am_Object((Am_Object *)selected_objs,&Am_No_Object);
      objs = &local_88;
      old_group = &local_d0;
      new_group = &local_d8;
      remove_and_add_objects(objs,old_group,new_group,(Am_Object *)selected_objs);
    }
    else if ((char)local_e0 == '\0') {
      Am_Value_List::Am_Value_List(&local_58,&local_100);
      adjust_objects_positions(&local_58,-left_offset,-top_offset);
      Am_Value_List::~Am_Value_List(&local_58);
      Am_Value_List::Am_Value_List(&local_68,&local_100);
      Am_Object::Am_Object(&local_c0,local_f0);
      Am_Object::Am_Object(&local_c8,&local_e8);
      selected_objs = (Am_Value_List *)(local_b0 + 8);
      Am_Object::Am_Object((Am_Object *)selected_objs,&Am_No_Object);
      objs = &local_68;
      old_group = &local_c0;
      new_group = &local_c8;
      remove_and_add_objects(objs,old_group,new_group,(Am_Object *)selected_objs);
    }
    else {
      Am_Value_List::Am_Value_List(&local_48,&local_100);
      Am_Object::Am_Object(&local_b8,local_f0);
      new_group = &local_a0;
      Am_Object::Am_Object(new_group,&local_e8);
      selected_objs = (Am_Value_List *)&stack0xffffffffffffffc8;
      objs = &local_48;
      old_group = &local_b8;
      put_objects_into_group(selected_objs,objs,(Am_Object *)&local_98,old_group);
    }
    Am_Object::~Am_Object((Am_Object *)selected_objs);
    Am_Object::~Am_Object(new_group);
    Am_Object::~Am_Object(old_group);
    Am_Value_List::~Am_Value_List(objs);
    Am_Value_List::Next(sub_groups);
  }
  Am_Object::~Am_Object(&local_e8);
  Am_Value_List::~Am_Value_List(&local_98);
  Am_Value_List::~Am_Value_List(&local_100);
  return;
}

Assistant:

void
in_or_out_of_sub_groups(Am_Value_List sub_groups, Am_Object group,
                        bool into_sub_group, bool recalc)
{
  Am_Value_List sub_group_parts, dummy_list;
  int left, top;
  Am_Object sub_group;
  for (sub_groups.Start(); !sub_groups.Last(); sub_groups.Next()) {
    sub_group = sub_groups.Get();
    left = sub_group.Get(Am_LEFT);
    top = sub_group.Get(Am_TOP);
    sub_group_parts = sub_group.Get(Am_OBJECT_MODIFIED_PLACES);
    if (into_sub_group) {
      if (recalc)
        put_objects_into_group(sub_group_parts, dummy_list, group, sub_group);
      else {
        adjust_objects_positions(sub_group_parts, -left, -top);
        remove_and_add_objects(sub_group_parts, group, sub_group);
      }
    } else {
      adjust_objects_positions(sub_group_parts, left, top);
      remove_and_add_objects(sub_group_parts, sub_group, group);
    }
  }
}